

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orthographic_camera_estimation_linear.hpp
# Opt level: O0

ScaledOrthoProjectionParameters *
eos::fitting::estimate_orthographic_projection_linear
          (ScaledOrthoProjectionParameters *__return_storage_ptr__,
          vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
          *image_points,
          vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
          *model_points,bool is_viewport_upsidedown,optional<int> viewport_height)

{
  float fVar1;
  float fVar2;
  int iVar3;
  bool bVar4;
  size_type sVar5;
  size_type sVar6;
  runtime_error *this;
  int *piVar7;
  Scalar *pSVar8;
  ulong uVar9;
  DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *pDVar10;
  DenseBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *other;
  CoeffReturnType pfVar11;
  MatrixUType *other_00;
  MatrixVType *other_01;
  RealScalar RVar12;
  RealScalar RVar13;
  float fVar14;
  Scalar SVar15;
  float t2;
  float t1;
  Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_0>
  local_608;
  Type local_5f8;
  Type local_5c8;
  NegativeReturnType local_598;
  non_const_type local_560;
  Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_0>
  local_558;
  undefined1 local_544 [8];
  Matrix3f R_ortho;
  Matrix3f V;
  Matrix3f U;
  JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> svd;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_3cc [12];
  Type local_3c0;
  Type local_390;
  MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> local_360 [8];
  Vector3f r2;
  Vector3f r1;
  Matrix3f R;
  float s;
  float sTy;
  float sTx;
  Matrix<float,3,1,0,3,1> local_2e4 [8];
  Vector3f R2;
  Matrix<float,3,1,0,3,1> local_2a4 [8];
  Vector3f R1;
  Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,__1,_8,_0,__1,_8>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
  local_178;
  Matrix<float,8,1,0,8,1> local_168 [8];
  Matrix<float,_8,_1,_0,_8,_1> k;
  Type local_140;
  int local_10c;
  int local_108;
  int i_1;
  undefined1 local_100 [8];
  Matrix<float,__1,_1,_0,__1,_1> b;
  Type local_c0;
  int local_8c;
  DenseBase<Eigen::Matrix<float,__1,_8,_0,__1,_8>_> local_88 [4];
  int i;
  undefined1 local_78 [8];
  Matrix<float,__1,_8,_0,__1,_8> A;
  Matrix<float,_2,_1,_0,_2,_1> *ip;
  iterator __end3;
  iterator __begin3;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  *__range3;
  int num_correspondences;
  bool is_viewport_upsidedown_local;
  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  *model_points_local;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  *image_points_local;
  optional<int> viewport_height_local;
  
  image_points_local =
       (vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        *)viewport_height.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>;
  viewport_height_local.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)__return_storage_ptr__;
  sVar5 = std::
          vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
          ::size(image_points);
  sVar6 = std::
          vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
          ::size(model_points);
  if (sVar5 != sVar6) {
    __assert_fail("image_points.size() == model_points.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/orthographic_camera_estimation_linear.hpp"
                  ,0x4d,
                  "ScaledOrthoProjectionParameters eos::fitting::estimate_orthographic_projection_linear(std::vector<Eigen::Vector2f>, std::vector<Eigen::Vector4f>, bool, cpp17::optional<int>)"
                 );
  }
  sVar5 = std::
          vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
          ::size(image_points);
  if (sVar5 < 4) {
    __assert_fail("image_points.size() >= 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/orthographic_camera_estimation_linear.hpp"
                  ,0x4e,
                  "ScaledOrthoProjectionParameters eos::fitting::estimate_orthographic_projection_linear(std::vector<Eigen::Vector2f>, std::vector<Eigen::Vector4f>, bool, cpp17::optional<int>)"
                 );
  }
  sVar5 = std::
          vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
          ::size(image_points);
  if (is_viewport_upsidedown) {
    bVar4 = std::operator==(&image_points_local);
    if (bVar4) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this,
                 "Error: If is_viewport_upsidedown is set to true, viewport_height needs to be given."
                );
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    __end3 = std::
             vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
             ::begin(image_points);
    ip = (Matrix<float,_2,_1,_0,_2,_1> *)
         std::
         vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
         ::end(image_points);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_*,_std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                                       *)&ip), bVar4) {
      A.super_PlainObjectBase<Eigen::Matrix<float,__1,_8,_0,__1,_8>_>.m_storage.m_rows =
           (Index)__gnu_cxx::
                  __normal_iterator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_*,_std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                  ::operator*(&__end3);
      piVar7 = std::optional<int>::value((optional<int> *)&image_points_local);
      iVar3 = *piVar7;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1> *)
                          A.super_PlainObjectBase<Eigen::Matrix<float,__1,_8,_0,__1,_8>_>.m_storage.
                          m_rows,1);
      fVar1 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1> *)
                          A.super_PlainObjectBase<Eigen::Matrix<float,__1,_8,_0,__1,_8>_>.m_storage.
                          m_rows,1);
      *pSVar8 = (float)iVar3 - fVar1;
      __gnu_cxx::
      __normal_iterator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_*,_std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
      ::operator++(&__end3);
    }
  }
  Eigen::DenseBase<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>_>::Zero(local_88,(long)((int)sVar5 << 1),8)
  ;
  Eigen::Matrix<float,-1,8,0,-1,8>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,8,0,_1,8>>>
            ((Matrix<float,_1,8,0,_1,8> *)local_78,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_8,_0,__1,_8>_>_>
              *)local_88);
  for (local_8c = 0; uVar9 = (ulong)local_8c,
      sVar6 = std::
              vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
              ::size(model_points), uVar9 < sVar6; local_8c = local_8c + 1) {
    pDVar10 = (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
              std::
              vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
              ::operator[](model_points,(long)local_8c);
    Eigen::DenseBase<Eigen::Matrix<float,-1,8,0,-1,8>>::block<1,4>
              (&local_c0,(DenseBase<Eigen::Matrix<float,_1,8,0,_1,8>> *)local_78,
               (long)(local_8c * 2),0);
    Eigen::Block<Eigen::Matrix<float,-1,8,0,-1,8>,1,4,false>::operator=
              ((Block<Eigen::Matrix<float,_1,8,0,_1,8>,1,4,false> *)&local_c0,pDVar10);
    pDVar10 = (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
              std::
              vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
              ::operator[](model_points,(long)local_8c);
    Eigen::DenseBase<Eigen::Matrix<float,-1,8,0,-1,8>>::block<1,4>
              ((Type *)&b.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows,(DenseBase<Eigen::Matrix<float,_1,8,0,_1,8>> *)local_78,
               (long)(local_8c * 2 + 1),4);
    Eigen::Block<Eigen::Matrix<float,-1,8,0,-1,8>,1,4,false>::operator=
              ((Block<Eigen::Matrix<float,_1,8,0,_1,8>,1,4,false> *)
               &b.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               pDVar10);
  }
  i_1 = (int)sVar5 * 2;
  local_108 = 1;
  Eigen::Matrix<float,-1,1,0,-1,1>::Matrix<int,int>
            ((Matrix<float,_1,1,0,_1,1> *)local_100,&i_1,&local_108);
  for (local_10c = 0; uVar9 = (ulong)local_10c,
      sVar5 = std::
              vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
              ::size(image_points), uVar9 < sVar5; local_10c = local_10c + 1) {
    other = (DenseBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)
            std::
            vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
            ::operator[](image_points,(long)local_10c);
    Eigen::DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::segment<2>
              (&local_140,(DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_100,
               (long)(local_10c * 2),2);
    Eigen::Block<Eigen::Matrix<float,-1,1,0,-1,1>,2,1,false>::operator=
              ((Block<Eigen::Matrix<float,_1,1,0,_1,1>,2,1,false> *)&local_140,other);
  }
  Eigen::MatrixBase<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>_>::colPivHouseholderQr
            ((ColPivHouseholderQR<Eigen::Matrix<float,__1,_8,_0,__1,_8>_> *)
             (R1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),(MatrixBase<Eigen::Matrix<float,__1,_8,_0,__1,_8>_> *)local_78);
  local_178 = Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,-1,8,0,-1,8>>>::
              solve<Eigen::Matrix<float,_1,1,0,_1,1>>
                        ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,_1,8,0,_1,8>>> *
                         )(R1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array + 1),
                         (MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_100);
  Eigen::Matrix<float,8,1,0,8,1>::
  Matrix<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,_1,8,0,_1,8>>,Eigen::Matrix<float,_1,1,0,_1,1>>>
            (local_168,
             (EigenBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,__1,_8,_0,__1,_8>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
              *)&local_178);
  Eigen::ColPivHouseholderQR<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>_>::~ColPivHouseholderQR
            ((ColPivHouseholderQR<Eigen::Matrix<float,__1,_8,_0,__1,_8>_> *)
             (R1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::DenseBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>::segment<3>
            ((Type *)(R2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array + 1),(DenseBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_> *)local_168
             ,0,3);
  Eigen::Matrix<float,3,1,0,3,1>::
  Matrix<Eigen::Block<Eigen::Matrix<float,8,1,0,8,1>const,3,1,false>>
            (local_2a4,
             (EigenBase<Eigen::Block<const_Eigen::Matrix<float,_8,_1,_0,_8,_1>,_3,_1,_false>_> *)
             (R2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::DenseBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>::segment<3>
            ((Type *)&sTy,(DenseBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_> *)local_168,4,3);
  Eigen::Matrix<float,3,1,0,3,1>::
  Matrix<Eigen::Block<Eigen::Matrix<float,8,1,0,8,1>const,3,1,false>>
            (local_2e4,
             (EigenBase<Eigen::Block<const_Eigen::Matrix<float,_8,_1,_0,_8,_1>,_3,_1,_false>_> *)
             &sTy);
  pfVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>,_0> *)local_168,3);
  fVar1 = *pfVar11;
  pfVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>,_0> *)local_168,7);
  fVar2 = *pfVar11;
  RVar12 = Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::norm
                     ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_2a4);
  RVar13 = Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::norm
                     ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_2e4);
  fVar14 = (RVar12 + RVar13) * 0.5;
  Eigen::Matrix<float,_3,_3,_0,_3,_3>::Matrix
            ((Matrix<float,_3,_3,_0,_3,_3> *)
             (r1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::normalized
            ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             (r2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::normalized(local_360);
  Eigen::DenseBase<Eigen::Matrix<float,3,3,0,3,3>>::block<1,3>
            (&local_390,
             (DenseBase<Eigen::Matrix<float,3,3,0,3,3>> *)
             (r1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),0,0);
  Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false>::operator=
            ((Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false> *)&local_390,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             (r2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::DenseBase<Eigen::Matrix<float,3,3,0,3,3>>::block<1,3>
            (&local_3c0,
             (DenseBase<Eigen::Matrix<float,3,3,0,3,3>> *)
             (r1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),1,0);
  Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false>::operator=
            ((Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false> *)&local_3c0,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_360);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            (local_3cc,
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             (r2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::DenseBase<Eigen::Matrix<float,3,3,0,3,3>>::block<1,3>
            ((Type *)(svd.m_scaledMatrix.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                      .m_storage.m_data.array + 7),
             (DenseBase<Eigen::Matrix<float,3,3,0,3,3>> *)
             (r1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),2,0);
  Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false>::operator=
            ((Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false> *)
             (svd.m_scaledMatrix.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
              m_storage.m_data.array + 7),
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_3cc);
  Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::JacobiSVD
            ((JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *)
             (U.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
             7),(MatrixType *)
                (r1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array + 1),0x14);
  other_00 = Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>::matrixU
                       ((SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_> *)
                        (U.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                         m_data.array + 7));
  Eigen::Matrix<float,_3,_3,_0,_3,_3>::Matrix
            ((Matrix<float,_3,_3,_0,_3,_3> *)
             (V.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
             7),other_00);
  other_01 = Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>::matrixV
                       ((SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_> *)
                        (U.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                         m_data.array + 7));
  Eigen::Matrix<float,_3,_3,_0,_3,_3>::Matrix
            ((Matrix<float,_3,_3,_0,_3,_3> *)
             (R_ortho.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
              array + 7),other_01);
  local_560 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::transpose
                        ((DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                         (R_ortho.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array + 7));
  local_558 = Eigen::MatrixBase<Eigen::Matrix<float,3,3,0,3,3>>::operator*
                        ((MatrixBase<Eigen::Matrix<float,3,3,0,3,3>> *)
                         (V.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array + 7),
                         (MatrixBase<Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>
                          *)&local_560);
  Eigen::Matrix<float,3,3,0,3,3>::
  Matrix<Eigen::Product<Eigen::Matrix<float,3,3,0,3,3>,Eigen::Transpose<Eigen::Matrix<float,3,3,0,3,3>const>,0>>
            ((Matrix<float,3,3,0,3,3> *)local_544,
             (EigenBase<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_0>_>
              *)&local_558);
  SVar15 = Eigen::MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::determinant
                     ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)local_544);
  if (SVar15 < 0.0) {
    Eigen::DenseBase<Eigen::Matrix<float,3,3,0,3,3>>::block<1,3>
              (&local_5c8,
               (DenseBase<Eigen::Matrix<float,3,3,0,3,3>> *)
               (V.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               + 7),2,0);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
              (&local_598,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
               &local_5c8);
    Eigen::DenseBase<Eigen::Matrix<float,3,3,0,3,3>>::block<1,3>
              (&local_5f8,
               (DenseBase<Eigen::Matrix<float,3,3,0,3,3>> *)
               (V.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               + 7),2,0);
    Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false>::operator=
              ((Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false> *)&local_5f8,
               (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
                *)&local_598);
    _t2 = Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::transpose
                    ((DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                     (R_ortho.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                      m_data.array + 7));
    local_608 = Eigen::MatrixBase<Eigen::Matrix<float,3,3,0,3,3>>::operator*
                          ((MatrixBase<Eigen::Matrix<float,3,3,0,3,3>> *)
                           (V.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data.array + 7),
                           (MatrixBase<Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>
                            *)&t2);
    Eigen::Matrix<float,3,3,0,3,3>::operator=
              ((Matrix<float,3,3,0,3,3> *)local_544,
               (DenseBase<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_0>_>
                *)&local_608);
  }
  Eigen::Matrix<float,_3,_3,_0,_3,_3>::Matrix
            (&__return_storage_ptr__->R,(Matrix<float,_3,_3,_0,_3,_3> *)local_544);
  __return_storage_ptr__->tx = fVar1 / fVar14;
  __return_storage_ptr__->ty = fVar2 / fVar14;
  __return_storage_ptr__->s = fVar14;
  Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::~JacobiSVD
            ((JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *)
             (U.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
             7));
  Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)local_100);
  Eigen::Matrix<float,_-1,_8,_0,_-1,_8>::~Matrix((Matrix<float,__1,_8,_0,__1,_8> *)local_78);
  return __return_storage_ptr__;
}

Assistant:

inline ScaledOrthoProjectionParameters estimate_orthographic_projection_linear(
    std::vector<Eigen::Vector2f> image_points, std::vector<Eigen::Vector4f> model_points,
    bool is_viewport_upsidedown, cpp17::optional<int> viewport_height = cpp17::nullopt)
{
    using Eigen::Matrix;
    assert(image_points.size() == model_points.size());
    assert(image_points.size() >= 4); // Number of correspondence points given needs to be equal to or larger than 4

    const int num_correspondences = static_cast<int>(image_points.size());

    if (is_viewport_upsidedown)
    {
        if (viewport_height == cpp17::nullopt)
        {
            throw std::runtime_error(
                "Error: If is_viewport_upsidedown is set to true, viewport_height needs to be given.");
        }
        for (auto&& ip : image_points)
        {
            ip[1] = viewport_height.value() - ip[1];
        }
    }

    Matrix<float, Eigen::Dynamic, 8> A = Matrix<float, Eigen::Dynamic, 8>::Zero(2 * num_correspondences, 8);
    for (int i = 0; i < model_points.size(); ++i)
    {
        A.block<1, 4>(2 * i, 0) = model_points[i];       // even row - copy to left side (first row is row 0)
        A.block<1, 4>((2 * i) + 1, 4) = model_points[i]; // odd row - copy to right side
    } // 4th coord (homogeneous) is already 1

    Matrix<float, Eigen::Dynamic, 1> b(2 * num_correspondences, 1);
    for (int i = 0; i < image_points.size(); ++i)
    {
        b.segment<2>(2 * i) = image_points[i];
    }

    // The original implementation used SVD here to solve the linear system, but
    // QR seems to do the job fine too.
    const Matrix<float, 8, 1> k = A.colPivHouseholderQr().solve(b); // resulting affine matrix (8x1)

    // Extract all values from the estimated affine parameters k:
    const Eigen::Vector3f R1 = k.segment<3>(0);
    const Eigen::Vector3f R2 = k.segment<3>(4);
    const float sTx = k(3);
    const float sTy = k(7);
    const auto s = (R1.norm() + R2.norm()) / 2.0f;
    Eigen::Matrix3f R;
    Eigen::Vector3f r1 = R1.normalized(); // Not sure why R1.normalize() (in-place) produces a compiler error.
    Eigen::Vector3f r2 = R2.normalized();
    R.block<1, 3>(0, 0) = r1;
    R.block<1, 3>(1, 0) = r2;
    R.block<1, 3>(2, 0) = r1.cross(r2);

    // Set R to the closest orthonormal matrix to the estimated affine transform:
    Eigen::JacobiSVD<Eigen::Matrix3f, Eigen::NoQRPreconditioner> svd(R, Eigen::ComputeFullU | Eigen::ComputeFullV);
    Eigen::Matrix3f U = svd.matrixU();
    const Eigen::Matrix3f V = svd.matrixV();
    Eigen::Matrix3f R_ortho = U * V.transpose();

    // The determinant of R must be 1 for it to be a valid rotation matrix
    if (R_ortho.determinant() < 0)
    {
        U.block<1, 3>(2, 0) = -U.block<1, 3>(2, 0); // not tested
        R_ortho = U * V.transpose();
    }

    // Remove the scale from the translations:
    const auto t1 = sTx / s;
    const auto t2 = sTy / s;

    return ScaledOrthoProjectionParameters{R_ortho, t1, t2, s};
}